

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

void olsrv2_tc_init(void)

{
  oonf_class_add(&_tc_node_class);
  oonf_class_add(&_tc_edge_class);
  oonf_class_add(&_tc_attached_class);
  oonf_class_add(&_tc_endpoint_class);
  oonf_class_extension_add(&_nhdp_neighbor_extension);
  avl_init(&_tc_tree,avl_comp_netaddr,0);
  avl_init(&_tc_endpoint_tree,os_routing_avl_cmp_route_key,1);
  return;
}

Assistant:

void
olsrv2_tc_init(void) {
  oonf_class_add(&_tc_node_class);
  oonf_class_add(&_tc_edge_class);
  oonf_class_add(&_tc_attached_class);
  oonf_class_add(&_tc_endpoint_class);

  oonf_class_extension_add(&_nhdp_neighbor_extension);

  avl_init(&_tc_tree, avl_comp_netaddr, false);
  avl_init(&_tc_endpoint_tree, os_routing_avl_cmp_route_key, true);
}